

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

bool __thiscall
google::protobuf::internal::
KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
InsertOrReplaceNode(KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *this,KeyNode *node)

{
  ViewType VVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  NodeAndBucket NVar4;
  map_index_t local_44;
  map_index_t b;
  NodeAndBucket p;
  bool is_new;
  KeyNode *node_local;
  KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  p._15_1_ = 1;
  pbVar3 = KeyNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::key(node);
  VVar1 = (ViewType)std::__cxx11::string::operator_cast_to_basic_string_view((string *)pbVar3);
  NVar4 = FindHelper(this,VVar1);
  local_44 = NVar4.bucket;
  if (NVar4.node == (NodeBase *)0x0) {
    bVar2 = ResizeIfLoadIsOutOfRange(this,(ulong)((this->super_UntypedMapBase).num_elements_ + 1));
    if (bVar2) {
      pbVar3 = KeyNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::key(node);
      VVar1 = (ViewType)std::__cxx11::string::operator_cast_to_basic_string_view((string *)pbVar3);
      local_44 = BucketNumber(this,VVar1);
    }
  }
  else {
    EraseImpl(this,local_44,(KeyNode *)NVar4.node,true);
    p._15_1_ = 0;
  }
  InsertUnique(this,local_44,node);
  (this->super_UntypedMapBase).num_elements_ = (this->super_UntypedMapBase).num_elements_ + 1;
  return (bool)p._15_1_;
}

Assistant:

bool InsertOrReplaceNode(KeyNode* node) {
    bool is_new = true;
    auto p = this->FindHelper(node->key());
    map_index_t b = p.bucket;
    if (ABSL_PREDICT_FALSE(p.node != nullptr)) {
      EraseImpl(p.bucket, static_cast<KeyNode*>(p.node), true);
      is_new = false;
    } else if (ResizeIfLoadIsOutOfRange(num_elements_ + 1)) {
      b = BucketNumber(node->key());  // bucket_number
    }
    InsertUnique(b, node);
    ++num_elements_;
    return is_new;
  }